

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadCellOutputNum(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *pPin;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  
  piVar4 = &pCell->Child;
  iVar3 = 0;
  while( true ) {
    pPin = Scl_LibertyItem(p,*piVar4);
    if (pPin == (Scl_Item_t *)0x0) break;
    iVar1 = Scl_LibertyCompare(p,pPin->Key,"pin");
    if (iVar1 == 0) {
      pcVar2 = Scl_LibertyReadPinFormula(p,pPin);
      iVar3 = (iVar3 + 1) - (uint)(pcVar2 == (char *)0x0);
    }
    piVar4 = &pPin->Next;
  }
  return iVar3;
}

Assistant:

int Scl_LibertyReadCellOutputNum( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        if ( Scl_LibertyReadPinFormula(p, pPin) )
            Counter++;
    return Counter;
}